

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.cpp
# Opt level: O0

bool __thiscall Pathie::Path::is_absolute(Path *this)

{
  char *pcVar1;
  Path *this_local;
  
  pcVar1 = (char *)std::__cxx11::string::operator[]((ulong)this);
  return *pcVar1 == '/';
}

Assistant:

bool Path::is_absolute() const
{
#if defined(_PATHIE_UNIX)
  return m_path[0] == '/';
#elif defined(_WIN32)
  // / is root on current drive
  if (m_path[0] == '/')
    return true;

  return m_path[1] == ':'; // This is the only position where : is allowed on windows, and if it is there, the path is absolute with a drive letter (X:/)
#else
#error Unsupported system.
#endif
}